

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# theory_data.cpp
# Opt level: O1

TheoryTerm * __thiscall
Potassco::TheoryData::addTerm(TheoryData *this,Id_t termId,Tuple_t type,IdSpan *args)

{
  ulong uVar1;
  E *pEVar2;
  TheoryTerm *pTVar3;
  
  pEVar2 = (E *)operator_new(args->size * 4 + 8);
  *pEVar2 = type.val_;
  uVar1 = args->size;
  pEVar2[1] = (E)uVar1;
  memcpy(pEVar2 + 2,args->first,(uVar1 & 0xffffffff) << 2);
  if (((ulong)pEVar2 & 3) == 0) {
    pTVar3 = setTerm(this,termId);
    pTVar3->data_ = (ulong)pEVar2 | 2;
    return pTVar3;
  }
  fail(-2,"uint64_t Potassco::TheoryTerm::assertPtr(const void *) const",0x46,"(data & 3u) == 0u",
       "Invalid pointer alignment",0);
}

Assistant:

const TheoryTerm& TheoryData::addTerm(Id_t termId, Tuple_t type, const IdSpan& args) {
	return setTerm(termId) = TheoryTerm(FuncData::newFunc(static_cast<int32_t>(type), args));
}